

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp.c
# Opt level: O0

int rtp_pkt_read(rtp_pkt_t *pkt,int fd)

{
  int iVar1;
  size_t sVar2;
  ssize_t len;
  int fd_local;
  rtp_pkt_t *pkt_local;
  
  if (pkt != (rtp_pkt_t *)0x0) {
    iVar1 = unix_read(fd,pkt->data,0x5dc);
    sVar2 = (size_t)iVar1;
    if (sVar2 == 0xffffffffffffffff) {
      pkt_local._4_4_ = -1;
    }
    else if (sVar2 == 0) {
      pkt_local._4_4_ = 0;
    }
    else if ((long)sVar2 < 0xc) {
      pkt_local._4_4_ = -1;
    }
    else {
      pkt->length = sVar2;
      pkt_local._4_4_ = rtp_pkt_unpack(pkt);
    }
    return pkt_local._4_4_;
  }
  __assert_fail("pkt != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp.c",
                0x9d,"int rtp_pkt_read(rtp_pkt_t *, int)");
}

Assistant:

int rtp_pkt_read(rtp_pkt_t *pkt, int fd) {
  assert(pkt != NULL);
  
  ssize_t len;
  switch (len = unix_read(fd, pkt->data, RTP_PKT_SIZE)) {
  case 0:
    /* EOF */
    return 0;
  case -1:
    /* error */
    return -1;
  default:
    break;
  }

  /*M
    Check if the packet is long enough.
  **/
  if (len < RTP_HDR_SIZE)
    return -1;
  
  pkt->length = len;

  
  return rtp_pkt_unpack(pkt);
}